

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O1

int __thiscall PFData::loadPQR(PFData *this)

{
  FILE *__stream;
  bool bVar1;
  size_t sVar2;
  int iVar3;
  char *__s;
  int iVar4;
  int iVar5;
  int ny;
  int nz;
  int nx;
  fpos_t pos;
  uint32_t local_5c;
  int local_58;
  uint32_t local_54;
  uint32_t local_50;
  int local_4c;
  fpos_t local_48;
  
  local_48.__pos = 0;
  local_48.__state.__count = 0;
  local_48.__state.__value = (_union_27)0x0;
  fgetpos((FILE *)this->m_fp,&local_48);
  iVar5 = 0;
  fseek((FILE *)this->m_fp,0x4c,0);
  this->m_r = 0;
  this->m_q = 0;
  this->m_p = 0;
  bVar1 = 0 < this->m_numSubgrids;
  if (0 < this->m_numSubgrids) {
    local_58 = 0;
    iVar3 = 0;
    do {
      __stream = (FILE *)this->m_fp;
      sVar2 = fread(&local_50,4,1,__stream);
      iVar4 = (int)sVar2;
      if (iVar4 == 1) {
        sVar2 = fread(&local_5c,4,1,__stream);
        iVar4 = (int)sVar2;
        if (iVar4 != 1) {
          __s = "Error reading ny in subgrid header";
          goto LAB_00104caa;
        }
        sVar2 = fread(&local_54,4,1,__stream);
        iVar4 = (int)sVar2;
        if (iVar4 != 1) {
          __s = "Error reading nz in subgrid header";
          goto LAB_00104caa;
        }
        local_50 = bswap32(local_50);
        local_5c = bswap32(local_5c);
        local_54 = bswap32(local_54);
        iVar4 = 0;
      }
      else {
        __s = "Error reading nx in subgrid header";
LAB_00104caa:
        perror(__s);
      }
      if (iVar4 == 0) {
        if (this->m_q == 0) {
          this->m_p = this->m_p + 1;
        }
        local_58 = local_58 + local_50;
        if (local_58 == this->m_nx) {
          iVar3 = iVar3 + local_5c;
          this->m_q = this->m_q + 1;
          local_58 = 0;
        }
        if (iVar3 == this->m_ny) {
          this->m_r = this->m_r + 1;
          iVar3 = 0;
        }
        if (iVar5 != this->m_numSubgrids + -1) {
          fseek((FILE *)this->m_fp,
                (long)(int)local_54 * (long)(int)local_50 * (long)(int)local_5c * 8 + 0x18,1);
        }
      }
      else {
        fsetpos((FILE *)this->m_fp,&local_48);
        local_4c = iVar4;
      }
      if (iVar4 != 0) break;
      iVar5 = iVar5 + 1;
      bVar1 = iVar5 < this->m_numSubgrids;
    } while (iVar5 < this->m_numSubgrids);
  }
  if (!bVar1) {
    fsetpos((FILE *)this->m_fp,&local_48);
    local_4c = 0;
  }
  return local_4c;
}

Assistant:

int PFData::loadPQR(){
    //Read nx, ny, nz from subgrid header.
    auto readValues = [](std::FILE* f, int& nx, int& ny, int& nz){
        int err = std::fread(&nx, 4, 1, f);
        if(err != 1){
            perror("Error reading nx in subgrid header");
            return err;
        }

        err = std::fread(&ny, 4, 1, f);
        if(err != 1){
            perror("Error reading ny in subgrid header");
            return err;
        }

        err = std::fread(&nz, 4, 1, f);
        if(err != 1){
            perror("Error reading nz in subgrid header");
            return err;
        }

        nx = bswap32(nx);
        ny = bswap32(ny);
        nz = bswap32(nz);

        return 0;
    };


    std::fpos_t pos{};
    //Save old position
    std::fgetpos(m_fp, &pos);
    std::fseek(m_fp, 64+12, SEEK_SET); //Skip file header and first 3 ints of the subgrid header.

    //Reset
    m_r = 0;
    m_q = 0;
    m_p = 0;

    int yDim{};
    int xDim{};


    //Each iter:
    //  if m_q == 0, m_p++
    //  Every time xDim == m_nx, add 1 to m_q
    //  Every time yDim == m_ny, add 1 to m_r

    for(int i = 0; i < m_numSubgrids; ++i){
        int nx, ny, nz;
        if(int err = readValues(m_fp, nx, ny, nz)){
            std::fsetpos(m_fp, &pos);
            return err;
        }

        xDim += nx;

        if(m_q == 0){
            m_p++;
        }

        if(xDim == m_nx){
            yDim += ny;     //Only increase y count once per row
            m_q++;
            xDim = 0;
        }

        if(yDim == m_ny){
            m_r++;
            yDim = 0;
        }

        if(i != m_numSubgrids-1){//Avoid skipping past end of file
            //Skip the last 3 ints of the subgrid header, the data, and the first 3 ints of the next subgrid header
            std::fseek(m_fp, 12+8*nx*ny*nz+12, SEEK_CUR);
        }

    }

    //Restore old position
    std::fsetpos(m_fp, &pos);
    return 0;
}